

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t scratch_seq_read(_internal_exr_seq_scratch *scr,void *buf,uint64_t sz)

{
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  uint64_t toread;
  int64_t nread_1;
  uint64_t nToRead;
  int64_t nread;
  uint64_t nPages;
  uint64_t nCopy;
  uint64_t nLeft;
  exr_result_t rv;
  uint64_t notdone;
  uint64_t nCopied;
  uint8_t *outbuf;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  int local_34;
  ulong local_30;
  ulong local_28;
  void *local_20;
  ulong local_18;
  long *local_8;
  
  local_28 = 0;
  local_34 = -1;
  local_30 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDX;
  local_8 = in_RDI;
LAB_00146ed8:
  do {
    if (local_30 == 0) {
LAB_00147159:
      if (local_34 == -1) {
        if (local_28 == local_18) {
          local_34 = 0;
        }
        else {
          local_34 = 10;
        }
      }
      return local_34;
    }
    if (local_8[2] < 1) {
      if (local_30 < 0x1000) {
        local_68 = 0;
        local_70 = 0x1000;
        if (*(long *)(local_8[6] + 0x98) < 1) {
          local_70 = 1;
        }
        else if (*(ulong *)(local_8[6] + 0x98) < local_8[3] + 0x1000U) {
          local_70 = *(long *)(local_8[6] + 0x98) - local_8[3];
        }
        local_34 = (**(code **)(local_8[6] + 0x28))
                             (local_8[6],*local_8,local_70,local_8 + 3,&local_68,1);
        if (local_68 < 1) {
          if (local_68 == 0) {
            local_34 = (**(code **)(local_8[6] + 0x40))
                                 (local_8[6],10,"End of file attempting to read header");
          }
          goto LAB_00147159;
        }
        local_8[2] = local_68;
        local_8[1] = 0;
      }
      else {
        local_50 = local_30 >> 0xc;
        local_58 = 0;
        local_60 = local_50 << 0xc;
        local_34 = (**(code **)(local_8[6] + 0x28))
                             (local_8[6],local_20,local_60,local_8 + 3,&local_58,0);
        if (local_58 < 1) goto LAB_00147159;
        local_30 = local_30 - local_58;
        local_20 = (void *)(local_58 + (long)local_20);
        local_28 = local_58 + local_28;
      }
      goto LAB_00146ed8;
    }
    local_40 = local_8[2];
    local_48 = local_30;
    if (local_40 < local_30) {
      local_48 = local_40;
    }
    memcpy(local_20,(void *)(*local_8 + local_8[1]),local_48);
    local_8[1] = local_48 + local_8[1];
    local_8[2] = local_8[2] - local_48;
    local_30 = local_30 - local_48;
    local_20 = (void *)(local_48 + (long)local_20);
    local_28 = local_48 + local_28;
  } while( true );
}

Assistant:

static exr_result_t
scratch_seq_read (struct _internal_exr_seq_scratch* scr, void* buf, uint64_t sz)
{
    uint8_t*     outbuf  = buf;
    uint64_t     nCopied = 0;
    uint64_t     notdone = sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            memcpy (outbuf, scr->scratch + scr->curpos, nCopy);
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            outbuf += nCopy;
            nCopied += nCopy;
        }
        else if (notdone >= SCRATCH_BUFFER_SIZE)
        {
            uint64_t nPages  = notdone / SCRATCH_BUFFER_SIZE;
            int64_t  nread   = 0;
            uint64_t nToRead = nPages * SCRATCH_BUFFER_SIZE;
            rv               = scr->ctxt->do_read (
                scr->ctxt,
                outbuf,
                nToRead,
                &(scr->fileoff),
                &nread,
                EXR_MUST_READ_ALL);
            if (nread > 0)
            {
                notdone -= (uint64_t) nread;
                outbuf += nread;
                nCopied += (uint64_t) nread;
            }
            else { break; }
        }
        else
        {
            int64_t nread = 0;
            uint64_t toread = SCRATCH_BUFFER_SIZE;

            if (scr->ctxt->file_size > 0)
            {
                if ((scr->fileoff + SCRATCH_BUFFER_SIZE) > scr->ctxt->file_size)
                {
                    toread = scr->ctxt->file_size - scr->fileoff;
                }
            }
            else
            {
                /*
                 * hrm, stream only with no known size, just read 1 byte at a
                 * time to be safer
                 */
                toread = 1;
            }

            rv = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                toread,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}